

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr.cpp
# Opt level: O3

void __thiscall pg::RRSolver::run(RRSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  uint64_t *puVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  uint to;
  ulong uVar10;
  ulong *puVar11;
  int *piVar12;
  int *__s;
  int *piVar13;
  ostream *poVar14;
  uint p;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint i;
  pointer *ppiVar19;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar9 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  uVar17 = (ulong)(iVar9 + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar17;
  uVar10 = SUB168(auVar7 * ZEXT816(0x18),0);
  uVar15 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar15 = 0xffffffffffffffff;
  }
  if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar15);
  *puVar11 = uVar17;
  if (iVar9 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar11 + 1),0,
           ((uVar10 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar11 + 1);
  uVar10 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar12 = (int *)operator_new__(uVar10);
  (this->super_PPSolver).region = piVar12;
  __s = (int *)operator_new__(uVar10);
  uVar17 = uVar17 << 2;
  (this->super_PPSolver).strategy = __s;
  if (iVar9 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar17);
  (this->super_PPSolver).inverse = piVar13;
  if (0 < (long)uVar16) {
    uVar10 = 0;
    puVar3 = ((this->super_PPSolver).super_Solver.disabled)->_bits;
    do {
      iVar9 = -2;
      if ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
        iVar9 = piVar2[uVar10];
      }
      piVar12[uVar10] = iVar9;
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
    if (0 < (long)uVar16) {
      memset(__s,0xff,uVar16 * 4);
    }
  }
  i = (int)uVar16 - 1;
  (this->super_PPSolver).promotions = 0;
joined_r0x00154d1b:
  while (-1 < (int)i) {
    piVar2 = ((this->super_PPSolver).super_Solver.game)->_priority;
    p = piVar2[i];
    while (uVar16 = (ulong)i, piVar2[uVar16] == p) {
      if (((((this->super_PPSolver).super_Solver.disabled)->_bits[i >> 6] >> (uVar16 & 0x3f) & 1) ==
           0) && ((this->super_PPSolver).region[uVar16] <= (int)p)) {
        (this->super_PPSolver).inverse[(int)p] = i;
        iVar9 = (*(this->super_PPSolver).super_Solver._vptr_Solver[5])(this,(ulong)p);
        bVar8 = PPSolver::setupRegion(&this->super_PPSolver,i,p,(bool)((byte)iVar9 ^ 1));
        if (bVar8) goto LAB_00154dbc;
        goto LAB_00154e2c;
      }
      bVar8 = (int)i < 1;
      i = i - 1;
      if (bVar8) goto LAB_00154e86;
    }
    pvVar4 = (this->super_PPSolver).regions;
    if (pvVar4[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        pvVar4[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      PPSolver::resetRegion(&this->super_PPSolver,p);
    }
  }
LAB_00154e86:
  pvVar4 = (this->super_PPSolver).regions;
  if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar19 = &pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar5 != (pointer)0x0) {
      lVar18 = (long)piVar5 * 0x18;
      do {
        pvVar6 = *(void **)((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar18);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)ppiVar19 + lVar18) - (long)pvVar6);
        }
        lVar18 = lVar18 + -0x18;
      } while (lVar18 != 0);
    }
    operator_delete__(ppiVar19,(long)piVar5 * 0x18 + 8);
  }
  piVar2 = (this->super_PPSolver).region;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  piVar2 = (this->super_PPSolver).strategy;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  piVar2 = (this->super_PPSolver).inverse;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  poVar14 = (this->super_PPSolver).super_Solver.logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"solved with ",0xc);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,(this->super_PPSolver).promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," promotions.",0xc);
  std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  return;
LAB_00154dbc:
  if (1 < (this->super_PPSolver).super_Solver.trace) {
    PPSolver::reportRegion(&this->super_PPSolver,p);
  }
  to = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,(ulong)i,(ulong)p);
  if (to == 0xffffffff) {
    PPSolver::setDominion(&this->super_PPSolver,p);
    i = (int)((this->super_PPSolver).super_Solver.game)->n_vertices - 1;
    goto joined_r0x00154d1b;
  }
  if (to == 0xfffffffe) goto LAB_00154e46;
  if (1 < (this->super_PPSolver).super_Solver.trace) {
    PPSolver::printState(&this->super_PPSolver);
  }
  PPSolver::promote(&this->super_PPSolver,p,to);
  if (1 < (this->super_PPSolver).super_Solver.trace) {
    PPSolver::printState(&this->super_PPSolver);
  }
  i = (this->super_PPSolver).inverse[(int)to];
  p = to;
  goto LAB_00154dbc;
LAB_00154e46:
  if ((int)i < 0) goto LAB_00154e86;
  while (((this->super_PPSolver).super_Solver.game)->_priority[i] == p) {
    bVar8 = (int)i < 1;
    i = i - 1;
    if (bVar8) goto LAB_00154e86;
  }
  goto joined_r0x00154d1b;
LAB_00154e2c:
  if (((this->super_PPSolver).super_Solver.game)->_priority[i] != p) goto joined_r0x00154d1b;
  bVar8 = (int)i < 1;
  i = i - 1;
  if (bVar8) goto LAB_00154e86;
  goto LAB_00154e2c;
}

Assistant:

void
RRSolver::run()
{
    // obtain highest priority and allocate arrays
    int max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, p, !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    if (trace >= 2) printState();
                    promote(p, res);
                    if (trace >= 2) printState();
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}